

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableKeyValueDisplay::CreateWalker(RecyclableKeyValueDisplay *this)

{
  LONG *pLVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  ReferencedArenaAdapter *pRVar4;
  IDiagObjectModelWalkerBase *pIVar5;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *pWVar6;
  ArenaAllocator *alloc_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pRVar4 = DebugManager::GetDiagnosticArena(this->scriptContext->threadContext->debugManager);
  if (pRVar4 == (ReferencedArenaAdapter *)0x0) {
    pWVar6 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
  }
  else {
    alloc_00 = (ArenaAllocator *)0x0;
    if (pRVar4->deleteFlag == false) {
      alloc_00 = pRVar4->arena;
    }
    pIVar5 = (IDiagObjectModelWalkerBase *)new<Memory::ArenaAllocator>(0x20,alloc_00,0x35916e);
    pp_Var2 = (_func_int **)this->value;
    pIVar5->_vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_0137fb80;
    pp_Var3 = (_func_int **)this->key;
    pIVar5[1]._vptr_IDiagObjectModelWalkerBase = (_func_int **)this->scriptContext;
    pIVar5[2]._vptr_IDiagObjectModelWalkerBase = pp_Var3;
    pIVar5[3]._vptr_IDiagObjectModelWalkerBase = pp_Var2;
    local_48 = (undefined1  [8])
               &Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3c7cb59;
    data.filename._0_4_ = 0xe41;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    pWVar6 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
             new<Memory::HeapAllocator>(0x10,alloc,0x2f6726);
    pWVar6->adapter = pRVar4;
    pWVar6->p = pIVar5;
    LOCK();
    pLVar1 = &(pRVar4->super_RefCounted).refCount;
    *pLVar1 = *pLVar1 + 1;
    UNLOCK();
  }
  return pWVar6;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableKeyValueDisplay::CreateWalker()
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), RecyclableKeyValueWalker, scriptContext, key, value);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, pOMWalker);
        }
        return nullptr;
    }